

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::detail::_SubstrWriter::append(_SubstrWriter *this,csubstr s)

{
  char *pcVar1;
  ulong in_RAX;
  ulong uVar2;
  size_t __n;
  char *__src;
  ulong uVar3;
  
  __n = s.len;
  __src = s.str;
  pcVar1 = (this->buf).str;
  uVar2 = (this->buf).len;
  if (pcVar1 < __src + __n && __src < pcVar1 + uVar2) {
    append();
    uVar2 = in_RAX;
  }
  uVar3 = this->pos + __n;
  if (uVar3 <= uVar2) {
    memcpy((this->buf).str + this->pos,__src,__n);
    uVar3 = __n + this->pos;
  }
  this->pos = uVar3;
  return;
}

Assistant:

void append(csubstr s)
    {
        C4_ASSERT(!s.overlaps(buf));
        if(pos + s.len <= buf.len)
            memcpy(buf.str + pos, s.str, s.len);
        pos += s.len;
    }